

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void predict_or_learn_adf<true,false>(cbify *data,multi_learner *base,example *ec)

{
  uint32_t uVar1;
  uint uVar2;
  example *peVar3;
  size_t sVar4;
  action_score *paVar5;
  int iVar6;
  vw_exception *pvVar7;
  uint32_t chosen_action;
  cb_class cl;
  string local_218;
  string local_1f8;
  score_iterator local_1d8;
  score_iterator local_1c8;
  stringstream __msg;
  ostream local_1a8;
  
  uVar1 = (ec->l).multi.label;
  copy_example_to_adf(data,ec);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (base,&(data->adf_data).ecs,0);
  peVar3 = *(data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar4 = data->example_counter;
  data->example_counter = sVar4 + 1;
  local_1c8._p = (action_score *)(peVar3->pred).scalars._begin;
  local_1c8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1d8._p = (action_score *)(peVar3->pred).scalars._end;
  local_1d8._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar6 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (sVar4 + data->app_seed,&local_1c8,&local_1d8,&chosen_action);
  if (iVar6 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,"Failed to sample from pdf");
    pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
               ,0xd0,&local_1f8);
    __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar5 = (peVar3->pred).a_s._begin;
  uVar2 = paVar5[chosen_action].action;
  cl.action = uVar2 + 1;
  cl.probability = *(float *)((long)(paVar5 + chosen_action) + 4);
  if (cl.action != 0) {
    cl.cost = (&data->loss0)[uVar1 != cl.action];
    v_array<CB::cb_class>::push_back
              ((v_array<CB::cb_class> *)
               &((data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar2]->l).simple,&cl);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
              (base,&(data->adf_data).ecs,0);
    (ec->pred).multiclass = cl.action;
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"No action with non-zero probability found!");
  pvVar7 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cbify.cc"
             ,0xd7,&local_218);
  __cxa_throw(pvVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void predict_or_learn_adf(cbify& data, multi_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  copy_example_to_adf(data, ec);
  base.predict(data.adf_data.ecs);

  auto& out_ec = *data.adf_data.ecs[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s),
          end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");

  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // add cb label to chosen action
  auto& lab = data.adf_data.ecs[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

  if (is_learn)
    base.learn(data.adf_data.ecs);

  ec.pred.multiclass = cl.action;
}